

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUISpriteBank.cpp
# Opt level: O0

void __thiscall
irr::gui::CGUISpriteBank::CGUISpriteBank(CGUISpriteBank *this,void **vtt,IGUIEnvironment *env)

{
  pointer prVar1;
  pointer in_RDX;
  undefined8 *in_RSI;
  array<irr::core::rect<int>_> *in_RDI;
  
  IGUISpriteBank::IGUISpriteBank((IGUISpriteBank *)in_RDI,(void **)(in_RSI + 1));
  (((_Vector_base<irr::gui::SGUISprite,_std::allocator<irr::gui::SGUISprite>_> *)
   &(in_RDI->m_data).
    super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>)->_M_impl).
  super__Vector_impl_data._M_start = (pointer)*in_RSI;
  *(undefined8 *)
   ((long)&(((_Vector_base<irr::gui::SGUISprite,_std::allocator<irr::gui::SGUISprite>_> *)
            &(in_RDI->m_data).
             super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>)->
           _M_impl).super__Vector_impl_data._M_start +
   (long)*(pointer *)
          ((long)&(((_Vector_base<irr::gui::SGUISprite,_std::allocator<irr::gui::SGUISprite>_> *)
                   &(in_RDI->m_data).
                    super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>
                   )->_M_impl).super__Vector_impl_data._M_start[-1].Frames.m_data + 0x10)) =
       in_RSI[3];
  core::array<irr::gui::SGUISprite>::array((array<irr::gui::SGUISprite> *)in_RDI);
  core::array<irr::core::rect<int>_>::array(in_RDI);
  core::array<irr::video::ITexture_*>::array((array<irr::video::ITexture_*> *)in_RDI);
  in_RDI[3].m_data.super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = in_RDX;
  in_RDI[3].m_data.super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (in_RDI[3].m_data.
      super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    prVar1 = (pointer)(**(code **)((long)(in_RDI[3].m_data.
                                          super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish)->
                                         UpperLeftCorner + 0x30))();
    in_RDI[3].m_data.
    super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = prVar1;
    if (in_RDI[3].m_data.
        super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      prVar1 = in_RDI[3].m_data.
               super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
      IReferenceCounted::grab
                ((IReferenceCounted *)
                 ((long)&(prVar1->UpperLeftCorner).X +
                 *(long *)((long)prVar1->UpperLeftCorner + -0x18)));
    }
  }
  return;
}

Assistant:

CGUISpriteBank::CGUISpriteBank(IGUIEnvironment *env) :
		Environment(env), Driver(0)
{
#ifdef _DEBUG
	setDebugName("CGUISpriteBank");
#endif

	if (Environment) {
		Driver = Environment->getVideoDriver();
		if (Driver)
			Driver->grab();
	}
}